

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O1

void aura_etable_add(aura_export_table *tbl,char *name,char *argfmt,char *retfmt)

{
  long lVar1;
  int iVar2;
  aura_node *paVar3;
  _ENTRY *p_Var4;
  char *pcVar5;
  long lVar6;
  ENTRY __item;
  ENTRY __item_00;
  int ret_valid;
  int arg_valid;
  ENTRY *ep;
  int local_40;
  int local_3c;
  ENTRY *local_38;
  
  local_3c = 1;
  local_40 = 1;
  if (tbl->next < tbl->size) {
    __item.data = (void *)0x0;
    __item.key = name;
    iVar2 = hsearch_r(__item,FIND,&local_38,(hsearch_data *)&tbl->index);
    if ((iVar2 != 0) && (local_38->data != (void *)0x0)) {
      BUG(tbl->owner,"Internal BUG: Duplicate export table entry: %s",name);
    }
    iVar2 = tbl->next;
    lVar6 = (long)iVar2;
    tbl->next = iVar2 + 1;
    tbl[lVar6 * 3 + 1].size = iVar2;
    if (name == (char *)0x0) {
      paVar3 = tbl->owner;
      pcVar5 = "Internal BUG: object name can\'t be nil";
    }
    else {
      paVar3 = (aura_node *)strdup(name);
      tbl[lVar6 * 3 + 1].owner = paVar3;
      if (argfmt != (char *)0x0) {
        p_Var4 = (_ENTRY *)strdup(argfmt);
        tbl[lVar6 * 3 + 1].index.table = p_Var4;
      }
      if (retfmt != (char *)0x0) {
        pcVar5 = strdup(retfmt);
        *(char **)&tbl[lVar6 * 3 + 1].index.size = pcVar5;
      }
      if (((argfmt == (char *)0x0) || (tbl[lVar6 * 3 + 1].index.table != (_ENTRY *)0x0)) &&
         ((retfmt == (char *)0x0 ||
          (lVar1._0_4_ = tbl[lVar6 * 3 + 1].index.size,
          lVar1._4_4_ = tbl[lVar6 * 3 + 1].index.filled, lVar1 != 0)))) {
        if (argfmt != (char *)0x0) {
          paVar3 = (aura_node *)
                   aura_fmt_pretty_print(argfmt,&local_3c,(int *)&tbl[lVar6 * 3 + 2].index.size);
          tbl[lVar6 * 3 + 2].owner = paVar3;
        }
        if (retfmt != (char *)0x0) {
          p_Var4 = (_ENTRY *)
                   aura_fmt_pretty_print(retfmt,&local_40,(int *)&tbl[lVar6 * 3 + 2].index.filled);
          tbl[lVar6 * 3 + 2].index.table = p_Var4;
        }
        tbl[lVar6 * 3 + 2].size = (uint)(local_40 != 0 && local_3c != 0);
        if (local_40 == 0 || local_3c == 0) {
          slog(0,3,"Object %d (%s) has corrupt export table",(ulong)(uint)tbl[lVar6 * 3 + 1].size,
               tbl[lVar6 * 3 + 1].owner);
        }
        iVar2 = aura_fmt_len(tbl->owner,argfmt);
        tbl[lVar6 * 3 + 3].size = iVar2;
        iVar2 = aura_fmt_len(tbl->owner,retfmt);
        tbl[lVar6 * 3 + 3].next = iVar2;
        __item_00.data = tbl + lVar6 * 3 + 1;
        __item_00.key = (char *)tbl[lVar6 * 3 + 1].owner;
        iVar2 = hsearch_r(__item_00,ENTER,&local_38,(hsearch_data *)&tbl->index);
        if (iVar2 != 0) {
          return;
        }
        paVar3 = tbl->owner;
        pcVar5 = "Internal BUG: Error adding entry to hash table";
      }
      else {
        paVar3 = tbl->owner;
        pcVar5 = "Internal allocation error";
      }
    }
  }
  else {
    paVar3 = tbl->owner;
    pcVar5 = "Internal BUG: Insufficient export table storage";
  }
  BUG(paVar3,pcVar5);
}

Assistant:

void aura_etable_add(struct aura_export_table * tbl,
		     const char *		name,
		     const char *		argfmt,
		     const char *		retfmt)
{
	int ret;
	ENTRY e, *ep;
	int arg_valid = 1;
	int ret_valid = 1;
	struct aura_object *target;

	if (tbl->next >= tbl->size)
		BUG(tbl->owner, "Internal BUG: Insufficient export table storage");

	target = aura_etable_find(tbl, name);
	if (target != NULL)
		BUG(tbl->owner, "Internal BUG: Duplicate export table entry: %s", name);

	target = &tbl->objects[tbl->next];
	target->id = tbl->next++;
	if (!name)
		BUG(tbl->owner, "Internal BUG: object name can't be nil");
	else
		target->name = strdup(name);

	if (argfmt)
		target->arg_fmt = strdup(argfmt);
	if (retfmt)
		target->ret_fmt = strdup(retfmt);

	if ((argfmt && !target->arg_fmt) ||
	    (retfmt && !target->ret_fmt))
		BUG(tbl->owner, "Internal allocation error");

	if (argfmt)
		target->arg_pprinted = aura_fmt_pretty_print(argfmt, &arg_valid, &target->num_args);

	if (retfmt)
		target->ret_pprinted = aura_fmt_pretty_print(retfmt, &ret_valid, &target->num_rets);

	target->valid = arg_valid && ret_valid;
	if (!target->valid)
		slog(0, SLOG_WARN, "Object %d (%s) has corrupt export table",
		     target->id, target->name);
	/* Calculate the sizes required */
	target->arglen = aura_fmt_len(tbl->owner, argfmt);
	target->retlen = aura_fmt_len(tbl->owner, retfmt);

	/* Add this shit to index */
	e.key = target->name;
	e.data = (char *)target;
	ret = hsearch_r(e, ENTER, &ep, &tbl->index);
	if (!ret)
		BUG(tbl->owner, "Internal BUG: Error adding entry to hash table");
}